

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL DeleteFileW(LPCWSTR lpFileName)

{
  int iVar1;
  DWORD DVar2;
  size_t sVar3;
  char *lpMultiByteStr;
  long in_FS_OFFSET;
  DWORD dwLastError;
  BOOL local_78;
  int local_74;
  BOOL bRet;
  int length;
  char *name;
  int size;
  CPalThread *pThread;
  LPCWSTR lpFileName_local;
  PathCharString namePS;
  
  namePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpFileName_local);
  local_74 = 0;
  local_78 = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpFileName != (LPCWSTR)0x0) {
    sVar3 = PAL_wcslen(lpFileName);
    local_74 = ((int)sVar3 + 1) * MaxWCharToAcpLengthFactor;
  }
  lpMultiByteStr =
       StackString<32UL,_char>::OpenStringBuffer
                 ((StackString<32UL,_char> *)&lpFileName_local,(long)local_74);
  if (lpMultiByteStr == (char *)0x0) {
    CorUnix::CPalThread::SetLastError(8);
  }
  else {
    iVar1 = WideCharToMultiByte(0,0,lpFileName,-1,lpMultiByteStr,local_74,(LPCSTR)0x0,(LPBOOL)0x0);
    StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpFileName_local,(long)iVar1);
    if (iVar1 == 0) {
      DVar2 = GetLastError();
      if (DVar2 == 0x7a) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        CorUnix::CPalThread::SetLastError(0xce);
      }
      else {
        fprintf(_stderr,"] %s %s:%d","DeleteFileW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x516);
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
        CorUnix::CPalThread::SetLastError(0x54f);
      }
      local_78 = 0;
    }
    else {
      local_78 = DeleteFileA(lpMultiByteStr);
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != namePS.m_count) {
      __stack_chk_fail();
    }
    return local_78;
  }
  abort();
}

Assistant:

BOOL
PALAPI
DeleteFileW(
        IN LPCWSTR lpFileName)
{
    CPalThread *pThread;
    int  size;
    PathCharString namePS;
    char * name;
    int length = 0;
    BOOL bRet = FALSE;

    PERF_ENTRY(DeleteFileW);
    ENTRY("DeleteFileW(lpFileName=%p (%S))\n",
      lpFileName?lpFileName:W16_NULLSTRING,
      lpFileName?lpFileName:W16_NULLSTRING);

    pThread = InternalGetCurrentThread();
    
    if (lpFileName != NULL)
    {
        length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    name = namePS.OpenStringBuffer(length);
    if (NULL == name)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }

    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, name, length,
                                NULL, NULL );
    namePS.CloseBuffer(size);
    
    if( size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFilePathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        bRet = FALSE;
        goto done;
    }

    bRet = DeleteFileA( name );

done:
    LOGEXIT("DeleteFileW returns BOOL %d\n", bRet);
    PERF_EXIT(DeleteFileW);
    return bRet;
}